

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void string_set(char **out,char *in)

{
  uint uVar1;
  size_t size;
  size_t sVar2;
  
  size = strlen(in);
  uVar1 = string_resize(out,size);
  if (uVar1 != 0) {
    for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
      (*out)[sVar2] = in[sVar2];
    }
  }
  return;
}

Assistant:

static void string_set(char** out, const char* in)
{
	size_t insize = strlen(in), i;
	if (string_resize(out, insize))
	{
		for (i = 0; i != insize; ++i)
		{
			(*out)[i] = in[i];
		}
	}
}